

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::mergeObjectLayoutQualifiers
          (HlslParseContext *this,TQualifier *dst,TQualifier *src,bool inheritOnly)

{
  bool bVar1;
  bool inheritOnly_local;
  TQualifier *src_local;
  TQualifier *dst_local;
  HlslParseContext *this_local;
  
  bVar1 = TQualifier::hasMatrix(src);
  if (bVar1) {
    *(ulong *)&dst->field_0x8 =
         *(ulong *)&dst->field_0x8 & 0x1fffffffffffffff |
         *(ulong *)&src->field_0x8 & 0xe000000000000000;
  }
  bVar1 = TQualifier::hasPacking(src);
  if (bVar1) {
    dst->field_0x10 = dst->field_0x10 & 0xf0 | src->field_0x10 & 0xf;
  }
  bVar1 = TQualifier::hasStream(src);
  if (bVar1) {
    *(ulong *)&dst->field_0x1c =
         *(ulong *)&dst->field_0x1c & 0xffffffffffffff |
         *(ulong *)&src->field_0x1c & 0xff00000000000000;
  }
  bVar1 = TQualifier::hasFormat(src);
  if (bVar1) {
    dst->field_0x2c = src->field_0x2c;
  }
  bVar1 = TQualifier::hasXfbBuffer(src);
  if (bVar1) {
    *(ulong *)&dst->field_0x24 =
         *(ulong *)&dst->field_0x24 & 0xfffffffffffffff0 |
         (ulong)((uint)*(undefined8 *)&src->field_0x24 & 0xf);
  }
  bVar1 = TQualifier::hasAlign(src);
  if (bVar1) {
    dst->layoutAlign = src->layoutAlign;
  }
  if (!inheritOnly) {
    bVar1 = TQualifier::hasLocation(src);
    if (bVar1) {
      *(ulong *)&dst->field_0x1c =
           *(ulong *)&dst->field_0x1c & 0xfffffffffffff000 |
           (ulong)((uint)*(undefined8 *)&src->field_0x1c & 0xfff);
    }
    bVar1 = TQualifier::hasComponent(src);
    if (bVar1) {
      *(ulong *)&dst->field_0x1c =
           *(ulong *)&dst->field_0x1c & 0xffffffffffff8fff |
           (ulong)((uint)(*(ulong *)&src->field_0x1c >> 0xc) & 7) << 0xc;
    }
    bVar1 = TQualifier::hasIndex(src);
    if (bVar1) {
      *(ulong *)&dst->field_0x1c =
           *(ulong *)&dst->field_0x1c & 0xff00ffffffffffff |
           (ulong)((ushort)((ulong)*(undefined8 *)&src->field_0x1c >> 0x30) & 0xff) << 0x30;
    }
    bVar1 = TQualifier::hasOffset(src);
    if (bVar1) {
      dst->layoutOffset = src->layoutOffset;
    }
    bVar1 = TQualifier::hasSet(src);
    if (bVar1) {
      *(ulong *)&dst->field_0x1c =
           *(ulong *)&dst->field_0x1c & 0xffffffffffc07fff |
           (ulong)((uint)(*(ulong *)&src->field_0x1c >> 0xf) & 0x7f) << 0xf;
    }
    if (((uint)((ulong)*(undefined8 *)&src->field_0x1c >> 0x20) & 0xffff) != 0xffff) {
      *(ulong *)&dst->field_0x1c =
           *(ulong *)&dst->field_0x1c & 0xffff0000ffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)&src->field_0x1c >> 0x20) & 0xffff) << 0x20;
    }
    bVar1 = TQualifier::hasXfbStride(src);
    if (bVar1) {
      *(ulong *)&dst->field_0x24 =
           *(ulong *)&dst->field_0x24 & 0xfffffffffffc000f |
           (ulong)((uint)(*(ulong *)&src->field_0x24 >> 4) & 0x3fff) << 4;
    }
    bVar1 = TQualifier::hasXfbOffset(src);
    if (bVar1) {
      *(ulong *)&dst->field_0x24 =
           *(ulong *)&dst->field_0x24 & 0xffffffff8003ffff |
           (ulong)((uint)(*(ulong *)&src->field_0x24 >> 0x12) & 0x1fff) << 0x12;
    }
    bVar1 = TQualifier::hasAttachment(src);
    if (bVar1) {
      *(ulong *)&dst->field_0x24 =
           *(ulong *)&dst->field_0x24 & 0xffffff00ffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)&src->field_0x24 >> 0x20) & 0xff) << 0x20;
    }
    bVar1 = TQualifier::hasSpecConstantId(src);
    if (bVar1) {
      *(ulong *)&dst->field_0x24 =
           *(ulong *)&dst->field_0x24 & 0xfff800ffffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)&src->field_0x24 >> 0x28) & 0x7ff) << 0x28;
    }
    if ((src->layoutPushConstant & 1U) != 0) {
      dst->layoutPushConstant = true;
    }
  }
  return;
}

Assistant:

void HlslParseContext::mergeObjectLayoutQualifiers(TQualifier& dst, const TQualifier& src, bool inheritOnly)
{
    if (src.hasMatrix())
        dst.layoutMatrix = src.layoutMatrix;
    if (src.hasPacking())
        dst.layoutPacking = src.layoutPacking;

    if (src.hasStream())
        dst.layoutStream = src.layoutStream;

    if (src.hasFormat())
        dst.layoutFormat = src.layoutFormat;

    if (src.hasXfbBuffer())
        dst.layoutXfbBuffer = src.layoutXfbBuffer;

    if (src.hasAlign())
        dst.layoutAlign = src.layoutAlign;

    if (! inheritOnly) {
        if (src.hasLocation())
            dst.layoutLocation = src.layoutLocation;
        if (src.hasComponent())
            dst.layoutComponent = src.layoutComponent;
        if (src.hasIndex())
            dst.layoutIndex = src.layoutIndex;

        if (src.hasOffset())
            dst.layoutOffset = src.layoutOffset;

        if (src.hasSet())
            dst.layoutSet = src.layoutSet;
        if (src.layoutBinding != TQualifier::layoutBindingEnd)
            dst.layoutBinding = src.layoutBinding;

        if (src.hasXfbStride())
            dst.layoutXfbStride = src.layoutXfbStride;
        if (src.hasXfbOffset())
            dst.layoutXfbOffset = src.layoutXfbOffset;
        if (src.hasAttachment())
            dst.layoutAttachment = src.layoutAttachment;
        if (src.hasSpecConstantId())
            dst.layoutSpecConstantId = src.layoutSpecConstantId;

        if (src.layoutPushConstant)
            dst.layoutPushConstant = true;
    }
}